

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

ssize_t __thiscall
ddd::DictionaryMLT<true,_true>::write
          (DictionaryMLT<true,_true> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  pointer this_00;
  size_type sVar2;
  pointer this_01;
  ssize_t extraout_RAX;
  void *__buf_00;
  void *__buf_01;
  size_t i;
  size_type num_suffixes;
  unsigned_long in_stack_ffffffffffffffe0;
  size_type val;
  bool val_00;
  
  this_00 = std::
            unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>
            ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                          *)0x17c300);
  DaTrie<true,_true,_true>::write(this_00,__fd,__buf_00,__n);
  sVar2 = std::
          vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
          ::size((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                  *)(this + 0x10));
  utils::write_value<unsigned_long>(in_stack_ffffffffffffffe0,(ostream *)this);
  for (val = 0; val < sVar2; val = val + 1) {
    std::
    vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
    ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                  *)((ostream *)this + 0x10),val);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                        *)0x17c35d);
    val_00 = SUB81(val >> 0x38,0);
    if (bVar1) {
      utils::write_value<bool>(val_00,(ostream *)this);
      std::
      vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                    *)((ostream *)this + 0x10),val);
      this_01 = std::
                unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                              *)0x17c38c);
      DaTrie<true,_true,_false>::write(this_01,__fd,__buf_01,__n);
    }
    else {
      utils::write_value<bool>(val_00,(ostream *)this);
    }
  }
  utils::write_value<unsigned_int>((uint)(val >> 0x20),(ostream *)this);
  utils::write_value<unsigned_long>(val,(ostream *)this);
  return extraout_RAX;
}

Assistant:

void write(std::ostream& os) const {
    prefix_subtrie_->write(os);
    auto num_suffixes = suffix_subtries_.size();
    utils::write_value(num_suffixes, os);
    for (size_t i = 0; i < num_suffixes; ++i) {
      if (suffix_subtries_[i]) {
        utils::write_value(true, os);
        suffix_subtries_[i]->write(os);
      } else {
        utils::write_value(false, os);
      }
    }
    utils::write_value(suffix_head_, os);
    utils::write_value(num_keys_, os);
  }